

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimvcd.cpp
# Opt level: O2

void __thiscall BtorSimVCDWriter::write_node_header(BtorSimVCDWriter *this,ModuleTreeNode *top)

{
  pointer ppMVar1;
  BtorSimVCDWriter *this_00;
  ostream *poVar2;
  iterator iVar3;
  iterator iVar4;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  _Base_ptr p_Var7;
  _Rb_tree_node_base *p_Var8;
  pointer ppMVar9;
  char *pcVar10;
  int64_t id;
  string symbol;
  pair<const_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  i;
  string type;
  string am_ident;
  string idx;
  long local_158;
  ostream *local_150;
  BtorSimVCDWriter *local_148;
  map<long,_BtorSimVCDWriter::ClkType,_std::less<long>,_std::allocator<std::pair<const_long,_BtorSimVCDWriter::ClkType>_>_>
  *local_140;
  map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_138;
  ModuleTreeNode *local_130;
  _Base_ptr local_128;
  _Base_ptr local_120;
  _Base_ptr local_118;
  _Base_ptr local_110;
  string local_108 [32];
  undefined1 local_e8 [48];
  undefined1 local_b8 [40];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  local_150 = (ostream *)&this->vcd_file;
  poVar2 = std::operator<<(local_150,"$scope module ");
  poVar2 = std::operator<<(poVar2,(string *)top);
  std::operator<<(poVar2," $end\n");
  local_118 = &(top->wire_names)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_138 = &this->bv_identifiers;
  local_120 = &(this->bv_identifiers)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_140 = &this->clocks;
  local_128 = &(this->clocks)._M_t._M_impl.super__Rb_tree_header._M_header;
  p_Var7 = (top->wire_names)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_148 = this;
  local_130 = top;
  while (this_00 = local_148, p_Var7 != local_118) {
    local_110 = p_Var7;
    std::
    pair<const_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
    ::pair((pair<const_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
            *)local_e8,
           (pair<const_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
            *)(p_Var7 + 1));
    local_158 = local_e8._0_8_;
    std::__cxx11::string::string(local_108,(string *)(local_e8 + 8));
    iVar3 = std::
            _Rb_tree<long,_std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&local_138->_M_t,&local_158);
    if (iVar3._M_node == local_120) {
      for (p_Var8 = (local_148->am_identifiers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
          ; (_Rb_tree_header *)p_Var8 != &(this->am_identifiers)._M_t._M_impl.super__Rb_tree_header;
          p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
        std::
        pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair((pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_b8,
               (pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)(p_Var8 + 1));
        if (local_b8._0_8_ == local_158) {
          std::__cxx11::string::string(local_50,(string *)(local_b8 + 8));
          std::__cxx11::string::string(local_70,local_90);
          poVar2 = std::operator<<(local_150,"$var wire ");
          poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
          poVar2 = std::operator<<(poVar2," ");
          poVar2 = std::operator<<(poVar2,local_70);
          poVar2 = std::operator<<(poVar2," ");
          poVar2 = std::operator<<(poVar2,local_108);
          poVar2 = std::operator<<(poVar2,"<");
          *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
               *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
          poVar2 = std::operator<<(poVar2,local_50);
          *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
               *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
          std::operator<<(poVar2,"> $end\n");
          std::__cxx11::string::~string(local_70);
          std::__cxx11::string::~string(local_50);
        }
        std::
        pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_b8);
      }
    }
    else {
      iVar4 = std::
              _Rb_tree<long,_std::pair<const_long,_BtorSimVCDWriter::ClkType>,_std::_Select1st<std::pair<const_long,_BtorSimVCDWriter::ClkType>_>,_std::less<long>,_std::allocator<std::pair<const_long,_BtorSimVCDWriter::ClkType>_>_>
              ::find(&local_140->_M_t,&local_158);
      pcVar10 = "wire";
      if (iVar4._M_node != local_128) {
        pmVar5 = std::
                 map<long,_BtorSimVCDWriter::ClkType,_std::less<long>,_std::allocator<std::pair<const_long,_BtorSimVCDWriter::ClkType>_>_>
                 ::operator[](local_140,&local_158);
        pcVar10 = "wire";
        if (*pmVar5 == EVENT) {
          pcVar10 = "event";
        }
      }
      std::__cxx11::string::string((string *)local_b8,pcVar10,(allocator *)local_50);
      poVar2 = std::operator<<(local_150,"$var ");
      poVar2 = std::operator<<(poVar2,(string *)local_b8);
      poVar2 = std::operator<<(poVar2," ");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      poVar2 = std::operator<<(poVar2," ");
      pmVar6 = std::
               map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](local_138,(key_type *)local_e8);
      poVar2 = std::operator<<(poVar2,(string *)pmVar6);
      poVar2 = std::operator<<(poVar2," ");
      poVar2 = std::operator<<(poVar2,local_108);
      std::operator<<(poVar2," $end\n");
      std::__cxx11::string::~string((string *)local_b8);
    }
    std::__cxx11::string::~string(local_108);
    std::__cxx11::string::~string((string *)(local_e8 + 8));
    p_Var7 = (_Base_ptr)std::_Rb_tree_increment(local_110);
  }
  ppMVar1 = (local_130->submodules).
            super__Vector_base<ModuleTreeNode_*,_std::allocator<ModuleTreeNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppMVar9 = (local_130->submodules).
                 super__Vector_base<ModuleTreeNode_*,_std::allocator<ModuleTreeNode_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppMVar9 != ppMVar1; ppMVar9 = ppMVar9 + 1) {
    write_node_header(this_00,*ppMVar9);
  }
  std::operator<<(local_150,"$upscope $end\n");
  return;
}

Assistant:

void
BtorSimVCDWriter::write_node_header (ModuleTreeNode* top)
{
  vcd_file << "$scope module " << top->name << " $end\n";
  for (auto i : top->wire_names)
  {
    int64_t id         = i.first;
    std::string symbol = i.second.first;
    uint32_t width     = i.second.second;
    if (bv_identifiers.find (id) != bv_identifiers.end ())
    {
      std::string type =
          (clocks.find (id) != clocks.end () && clocks[id] == EVENT) ? "event"
                                                                     : "wire";
      vcd_file << "$var " << type << " " << width << " "
               << bv_identifiers[i.first] << " " << symbol << " $end\n";
    }
    else
      for (auto j : am_identifiers)
      {
        if (j.first.first == id)
        {
          std::string idx      = j.first.second;
          std::string am_ident = j.second;
          vcd_file << "$var wire " << width << " " << am_ident << " " << symbol
                   << "<" << std::hex << idx << std::dec << "> $end\n";
        }
      }
  }
  for (ModuleTreeNode* s : top->submodules)
  {
    write_node_header (s);
  }
  vcd_file << "$upscope $end\n";
}